

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uchar * lodepng_chunk_next(uchar *chunk,uchar *end)

{
  uint uVar1;
  int iVar2;
  uchar *in_RSI;
  uchar *in_RDI;
  uchar *result;
  size_t total_chunk_length;
  size_t local_20;
  uchar *local_18;
  uchar *local_10;
  uchar *local_8;
  
  local_8 = in_RSI;
  if ((in_RDI < in_RSI) && (0xb < (long)in_RSI - (long)in_RDI)) {
    if ((((*in_RDI == 0x89) && (((in_RDI[1] == 'P' && (in_RDI[2] == 'N')) && (in_RDI[3] == 'G'))))
        && (((in_RDI[4] == '\r' && (in_RDI[5] == '\n')) && (in_RDI[6] == '\x1a')))) &&
       (in_RDI[7] == '\n')) {
      local_8 = in_RDI + 8;
    }
    else {
      local_18 = in_RSI;
      local_10 = in_RDI;
      uVar1 = lodepng_chunk_length((uchar *)0x161187);
      iVar2 = lodepng_addofl((ulong)uVar1,0xc,&local_20);
      if (iVar2 == 0) {
        local_8 = local_10 + local_20;
        if (local_8 < local_10) {
          local_8 = local_18;
        }
      }
      else {
        local_8 = local_18;
      }
    }
  }
  return local_8;
}

Assistant:

unsigned char* lodepng_chunk_next(unsigned char* chunk, unsigned char* end) {
  if (chunk >= end || end - chunk < 12) return end; /*too small to contain a chunk*/
  if (chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  }
  else {
    size_t total_chunk_length;
    unsigned char* result;
    if (lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return end;
    result = chunk + total_chunk_length;
    if (result < chunk) return end; /*pointer overflow*/
    return result;
  }
}